

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

Cnf_Dat_t * Cnf_ManWriteCnf(Cnf_Man_t *p,Vec_Ptr_t *vMapped,int nOutputs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  int *piVar8;
  void *pvVar9;
  Vec_Int_t *vCover_00;
  Cnf_Cut_t *pCVar10;
  uint *puVar11;
  Aig_Obj_t *pAVar12;
  int local_104;
  int Number;
  int Cube;
  int nClauses;
  int nLiterals;
  int k;
  int i;
  uint uTruth;
  int **pClas;
  int *pLits;
  int pVars [32];
  int PoVar;
  int OutVar;
  Vec_Int_t *vSopTemp;
  Vec_Int_t *vCover;
  Cnf_Cut_t *pCut;
  Cnf_Dat_t *pCnf;
  Aig_Obj_t *pObj;
  int fChangeVariableOrder;
  int nOutputs_local;
  Vec_Ptr_t *vMapped_local;
  Cnf_Man_t *p_local;
  
  iVar1 = Aig_ManCoNum(p->pManAig);
  Cube = iVar1 + 1 + nOutputs * 3;
  iVar1 = Aig_ManCoNum(p->pManAig);
  Number = iVar1 + 1 + nOutputs;
  for (nLiterals = 0; iVar1 = Vec_PtrSize(vMapped), nLiterals < iVar1; nLiterals = nLiterals + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vMapped,nLiterals);
    iVar1 = Aig_ObjIsNode(pAVar5);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0xd7,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
    }
    pCVar10 = Cnf_ObjBestCut(pAVar5);
    if (pCVar10->nFanins < '\x05') {
      puVar11 = Cnf_CutTruth(pCVar10);
      uVar2 = *puVar11 & 0xffff;
      iVar3 = Cnf_SopCountLiterals(p->pSops[uVar2],(int)p->pSopSizes[uVar2]);
      iVar3 = iVar3 + p->pSopSizes[uVar2];
      if (p->pSopSizes[uVar2] < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0xdf,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      iVar1 = (int)p->pSopSizes[uVar2];
    }
    else {
      iVar3 = Cnf_IsopCountLiterals(pCVar10->vIsop[1],(int)pCVar10->nFanins);
      iVar1 = Vec_IntSize(pCVar10->vIsop[1]);
      iVar3 = iVar3 + iVar1;
      iVar1 = Vec_IntSize(pCVar10->vIsop[1]);
    }
    Cube = iVar3 + Cube;
    Number = iVar1 + Number;
    if (pCVar10->nFanins < '\x05') {
      puVar11 = Cnf_CutTruth(pCVar10);
      uVar2 = (*puVar11 ^ 0xffffffff) & 0xffff;
      iVar3 = Cnf_SopCountLiterals(p->pSops[uVar2],(int)p->pSopSizes[uVar2]);
      iVar3 = iVar3 + p->pSopSizes[uVar2];
      if (p->pSopSizes[uVar2] < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0xec,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      iVar1 = (int)p->pSopSizes[uVar2];
    }
    else {
      iVar3 = Cnf_IsopCountLiterals(pCVar10->vIsop[0],(int)pCVar10->nFanins);
      iVar1 = Vec_IntSize(pCVar10->vIsop[0]);
      iVar3 = iVar3 + iVar1;
      iVar1 = Vec_IntSize(pCVar10->vIsop[0]);
    }
    Cube = iVar3 + Cube;
    Number = iVar1 + Number;
  }
  pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar6->pMan = p->pManAig;
  pCVar6->nLiterals = Cube;
  pCVar6->nClauses = Number;
  ppiVar7 = (int **)malloc((long)(Number + 1) << 3);
  pCVar6->pClauses = ppiVar7;
  piVar8 = (int *)malloc((long)Cube << 2);
  *pCVar6->pClauses = piVar8;
  pCVar6->pClauses[Number] = *pCVar6->pClauses + Cube;
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  piVar8 = (int *)malloc((long)iVar1 << 2);
  pCVar6->pVarNums = piVar8;
  for (nLiterals = 0; iVar1 = Aig_ManObjNumMax(p->pManAig), nLiterals < iVar1;
      nLiterals = nLiterals + 1) {
    pCVar6->pVarNums[nLiterals] = -1;
  }
  local_104 = 1;
  if (nOutputs != 0) {
    iVar1 = Aig_ManRegNum(p->pManAig);
    if (iVar1 == 0) {
      iVar1 = Aig_ManCoNum(p->pManAig);
      if (nOutputs != iVar1) {
        __assert_fail("nOutputs == Aig_ManCoNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x10e,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      for (nLiterals = 0; iVar1 = Vec_PtrSize(p->pManAig->vCos), nLiterals < iVar1;
          nLiterals = nLiterals + 1) {
        pvVar9 = Vec_PtrEntry(p->pManAig->vCos,nLiterals);
        pCVar6->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_104;
        local_104 = local_104 + 1;
      }
    }
    else {
      iVar1 = Aig_ManRegNum(p->pManAig);
      if (nOutputs != iVar1) {
        __assert_fail("nOutputs == Aig_ManRegNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x114,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      iVar1 = Aig_ManCoNum(p->pManAig);
      iVar3 = Aig_ManRegNum(p->pManAig);
      for (nLiterals = iVar1 - iVar3; iVar1 = Vec_PtrSize(p->pManAig->vCos), nLiterals < iVar1;
          nLiterals = nLiterals + 1) {
        pvVar9 = Vec_PtrEntry(p->pManAig->vCos,nLiterals);
        pCVar6->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_104;
        local_104 = local_104 + 1;
      }
    }
  }
  for (nLiterals = 0; iVar1 = Vec_PtrSize(vMapped), nLiterals < iVar1; nLiterals = nLiterals + 1) {
    pvVar9 = Vec_PtrEntry(vMapped,nLiterals);
    pCVar6->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_104;
    local_104 = local_104 + 1;
  }
  for (nLiterals = 0; iVar1 = Vec_PtrSize(p->pManAig->vCis), nLiterals < iVar1;
      nLiterals = nLiterals + 1) {
    pvVar9 = Vec_PtrEntry(p->pManAig->vCis,nLiterals);
    pCVar6->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_104;
    local_104 = local_104 + 1;
  }
  piVar8 = pCVar6->pVarNums;
  pAVar5 = Aig_ManConst1(p->pManAig);
  piVar8[pAVar5->Id] = local_104;
  pCVar6->nVars = local_104 + 1;
  vCover_00 = Vec_IntAlloc(0x10000);
  pClas = (int **)*pCVar6->pClauses;
  _i = pCVar6->pClauses;
  for (nLiterals = 0; iVar1 = Vec_PtrSize(vMapped), nLiterals < iVar1; nLiterals = nLiterals + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vMapped,nLiterals);
    pCVar10 = Cnf_ObjBestCut(pAVar5);
    iVar1 = pCVar6->pVarNums[pAVar5->Id];
    for (nClauses = 0; nClauses < pCVar10->nFanins; nClauses = nClauses + 1) {
      pVars[(long)nClauses + -2] =
           pCVar6->pVarNums[*(int *)((long)pCVar10[1].vIsop + (long)nClauses * 4 + -8)];
      iVar3 = pVars[(long)nClauses + -2];
      iVar4 = Aig_ManObjNumMax(p->pManAig);
      if (iVar4 < iVar3) {
        __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x14d,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
    }
    if (pCVar10->nFanins < '\x05') {
      puVar11 = Cnf_CutTruth(pCVar10);
      Cnf_SopConvertToVector
                (p->pSops[*puVar11 & 0xffff],(int)p->pSopSizes[*puVar11 & 0xffff],vCover_00);
      vSopTemp = vCover_00;
    }
    else {
      vSopTemp = pCVar10->vIsop[1];
    }
    for (nClauses = 0; iVar3 = Vec_IntSize(vSopTemp), nClauses < iVar3; nClauses = nClauses + 1) {
      iVar3 = Vec_IntEntry(vSopTemp,nClauses);
      *_i = (int *)pClas;
      *(int *)pClas = iVar1 << 1;
      iVar3 = Cnf_IsopWriteCube(iVar3,(int)pCVar10->nFanins,(int *)&pLits,(int *)((long)pClas + 4));
      pClas = (int **)((int *)((long)pClas + 4) + iVar3);
      _i = _i + 1;
    }
    if (pCVar10->nFanins < '\x05') {
      puVar11 = Cnf_CutTruth(pCVar10);
      uVar2 = (*puVar11 ^ 0xffffffff) & 0xffff;
      Cnf_SopConvertToVector(p->pSops[uVar2],(int)p->pSopSizes[uVar2],vCover_00);
      vSopTemp = vCover_00;
    }
    else {
      vSopTemp = pCVar10->vIsop[0];
    }
    for (nClauses = 0; iVar3 = Vec_IntSize(vSopTemp), nClauses < iVar3; nClauses = nClauses + 1) {
      iVar3 = Vec_IntEntry(vSopTemp,nClauses);
      *_i = (int *)pClas;
      *(int *)pClas = iVar1 * 2 + 1;
      iVar3 = Cnf_IsopWriteCube(iVar3,(int)pCVar10->nFanins,(int *)&pLits,(int *)((long)pClas + 4));
      pClas = (int **)((int *)((long)pClas + 4) + iVar3);
      _i = _i + 1;
    }
  }
  Vec_IntFree(vCover_00);
  piVar8 = pCVar6->pVarNums;
  pAVar5 = Aig_ManConst1(p->pManAig);
  iVar1 = piVar8[pAVar5->Id];
  iVar3 = Aig_ManObjNumMax(p->pManAig);
  if (iVar1 <= iVar3) {
    *_i = (int *)pClas;
    *(int *)pClas = iVar1 << 1;
    _i = _i + 1;
    pClas = (int **)((long)pClas + 4);
    for (nLiterals = 0; iVar1 = Vec_PtrSize(p->pManAig->vCos), nLiterals < iVar1;
        nLiterals = nLiterals + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,nLiterals);
      piVar8 = pCVar6->pVarNums;
      pAVar12 = Aig_ObjFanin0(pAVar5);
      iVar1 = piVar8[pAVar12->Id];
      iVar3 = Aig_ManCoNum(p->pManAig);
      if (nLiterals < iVar3 - nOutputs) {
        *_i = (int *)pClas;
        iVar3 = Aig_ObjFaninC0(pAVar5);
        *(int *)pClas = iVar1 * 2 + iVar3;
        _i = _i + 1;
        pClas = (int **)((long)pClas + 4);
      }
      else {
        iVar3 = pCVar6->pVarNums[pAVar5->Id];
        ppiVar7 = _i + 1;
        *_i = (int *)pClas;
        *(int *)pClas = iVar3 << 1;
        iVar4 = Aig_ObjFaninC0(pAVar5);
        *(uint *)((long)pClas + 4) = iVar1 * 2 + (uint)((iVar4 != 0 ^ 0xffU) & 1);
        _i = _i + 2;
        *ppiVar7 = (int *)(pClas + 1);
        piVar8 = (int *)((long)pClas + 0xc);
        *(int *)(pClas + 1) = iVar3 * 2 + 1;
        iVar3 = Aig_ObjFaninC0(pAVar5);
        pClas = pClas + 2;
        *piVar8 = iVar1 * 2 + iVar3;
      }
    }
    if ((long)pClas - (long)*pCVar6->pClauses >> 2 == (long)Cube) {
      if ((long)_i - (long)pCVar6->pClauses >> 3 == (long)Number) {
        return pCVar6;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0x191,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,400,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p->pManAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                ,0x174,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnf( Cnf_Man_t * p, Vec_Ptr_t * vMapped, int nOutputs )
{
    int fChangeVariableOrder = 0; // should be set to 0 to improve performance
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube, Number;

    // count the number of literals and clauses
    nLiterals = 1 + Aig_ManCoNum( p->pManAig ) + 3 * nOutputs;
    nClauses = 1 + Aig_ManCoNum( p->pManAig ) + nOutputs;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
//printf( "%d ", nClauses-(1 + Aig_ManCoNum( p->pManAig )) );
    }
//printf( "\n" );

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pVarNums[i] = -1;

    if ( !fChangeVariableOrder )
    {
        // assign variables to the last (nOutputs) POs
        Number = 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number++;
        pCnf->nVars = Number;
    }
    else
    {
        // assign variables to the last (nOutputs) POs
        Number = Aig_ManObjNumMax(p->pManAig) + 1;
        pCnf->nVars = Number + 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number--;
        assert( Number >= 0 );
    }

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        pCut = Cnf_ObjBestCut( pObj );

        // save variables of this cut
        OutVar = pCnf->pVarNums[ pObj->Id ];
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCnf->pVarNums[ pCut->pFanins[k] ];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
    }
    Vec_IntFree( vSopTemp );
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p->pManAig)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p->pManAig) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p->pManAig) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}